

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Arduino.h
# Opt level: O3

void __thiscall SpyingSerial::clear(SpyingSerial *this)

{
  long *local_38 [2];
  long local_28 [2];
  
  local_38[0] = local_28;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_38,"");
  std::__cxx11::stringbuf::str((string *)&this->field_0x18);
  if (local_38[0] != local_28) {
    operator_delete(local_38[0],local_28[0] + 1);
  }
  return;
}

Assistant:

void clear() { log_.str(""); }